

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse2.h
# Opt level: O2

void round_shift_16bit(__m128i *in,int size,int bit)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (bit < 0) {
    bVar1 = ~(byte)bit & 0x1f;
    auVar5 = ZEXT416((uint)(1 << bVar1));
    auVar5 = pshuflw(auVar5,auVar5,0);
    auVar5._4_4_ = auVar5._0_4_;
    auVar5._8_4_ = auVar5._0_4_;
    auVar5._12_4_ = auVar5._0_4_;
    uVar2 = 0 << bVar1;
    uVar3 = (ulong)uVar2;
    uVar4 = (ulong)(uint)size;
    if (size < 1) {
      uVar4 = (ulong)uVar2;
    }
    for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      auVar6 = paddsw(*(undefined1 (*) [16])((long)*in + uVar3),auVar5);
      auVar6 = psraw(auVar6,ZEXT416((uint)-bit));
      *(undefined1 (*) [16])((long)*in + uVar3) = auVar6;
    }
  }
  else if (bit != 0) {
    uVar3 = 0;
    uVar4 = (ulong)(uint)size;
    if (size < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
      auVar5 = psllw(*(undefined1 (*) [16])((long)*in + uVar3),ZEXT416((uint)bit));
      *(undefined1 (*) [16])((long)*in + uVar3) = auVar5;
    }
  }
  return;
}

Assistant:

static inline void round_shift_16bit(__m128i *in, int size, int bit) {
  if (bit < 0) {
    bit = -bit;
    __m128i rounding = _mm_set1_epi16(1 << (bit - 1));
    for (int i = 0; i < size; ++i) {
      in[i] = _mm_adds_epi16(in[i], rounding);
      in[i] = _mm_srai_epi16(in[i], bit);
    }
  } else if (bit > 0) {
    for (int i = 0; i < size; ++i) {
      in[i] = _mm_slli_epi16(in[i], bit);
    }
  }
}